

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool VerifyWitnessProgram
               (CScriptWitness *witness,int witversion,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *program,uint flags,
               BaseSignatureChecker *checker,ScriptError *serror,bool is_p2sh)

{
  long lVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pbVar4;
  char *pcVar5;
  pointer puVar6;
  pointer puVar7;
  byte *pbVar8;
  undefined8 data;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  CSHA256 *this;
  CScript *pCVar14;
  size_t sVar15;
  long lVar16;
  uint uVar17;
  size_t size;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script;
  span<const_std::byte,_18446744073709551615UL> b;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> control;
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_198;
  XOnlyPubKey p;
  ScriptExecutionData local_118;
  CScript exec_script;
  uint256 local_78;
  uint256 hash_exec_script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  exec_script.super_CScriptBase._union._16_8_ = 0;
  exec_script.super_CScriptBase._24_8_ = 0;
  exec_script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  exec_script.super_CScriptBase._union._8_8_ = 0;
  pvVar2 = (witness->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (witness->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)pvVar3 - (long)pvVar2;
  uVar12 = lVar16 / 0x18;
  local_118.m_annex_init = false;
  local_118.m_output_hash.super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = false;
  local_118.m_tapleaf_hash_init = false;
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_118.m_codeseparator_pos_init = false;
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_118.m_validation_weight_left_init = false;
  local_198.m_data = pvVar2;
  local_198.m_size = uVar12;
  if (witversion == 1) {
    if ((long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x20 || is_p2sh) goto LAB_001df00e;
    if ((flags >> 0x11 & 1) == 0) {
LAB_001df05b:
      bVar9 = true;
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_OK;
      }
      goto LAB_001df3cb;
    }
    if (pvVar3 == pvVar2) {
LAB_001df1a1:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY;
      }
    }
    else {
      if (((uVar12 < 2) ||
          (pcVar5 = *(char **)((long)pvVar2 + lVar16 + -0x18),
          pcVar5 == *(char **)((long)pvVar2 + lVar16 + -0x10))) || (*pcVar5 != 'P')) {
        local_118.m_annex_present = false;
      }
      else {
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        p.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        CSHA256::CSHA256((CSHA256 *)&p);
        uVar12 = uVar12 - 1;
        Serialize<HashWriter,unsigned_char,std::allocator<unsigned_char>>
                  ((HashWriter *)&p,pvVar2 + uVar12);
        HashWriter::GetSHA256(&hash_exec_script,(HashWriter *)&p);
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x10];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x11];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x12];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x13];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x14];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x15];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x16];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x17];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x18];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x19];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[1] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[1];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[2] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[2];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[3] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[3];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[4] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[4];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[5] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[5];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[6] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[6];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[7] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[7];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[8] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[8];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[9] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[9];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[10] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[10];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xb];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xc];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xd];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xe];
        local_118.m_annex_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xf];
        local_118.m_annex_present = true;
      }
      local_118.m_annex_init = true;
      if (uVar12 == 1) {
        puVar6 = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        puVar7 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar11 = (*checker->_vptr_BaseSignatureChecker[1])
                           (checker,puVar6,
                            (long)(pvVar2->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6,puVar7,
                            (long)(program->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7,2,
                            &local_118,serror);
        if ((char)iVar11 != '\0') goto LAB_001df05b;
      }
      else {
        local_198.m_size = uVar12 - 2;
        pbVar8 = pvVar2[uVar12 - 1].
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = (long)pvVar2[uVar12 - 1].
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pbVar8;
        if ((lVar16 - 0x1022U < 0xffffffffffffefff) || (((int)lVar16 - 1U & 0x1f) != 0)) {
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE;
          }
        }
        else {
          puVar6 = pvVar2[uVar12 - 2].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          script.m_size =
               (long)pvVar2[uVar12 - 2].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar6;
          script.m_data = puVar6;
          ComputeTapleafHash(&p.m_keydata,*pbVar8 & 0xfe,script);
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._16_7_ =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems._16_7_;
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17];
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._24_7_ =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems._24_7_;
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f];
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._0_7_ =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems._0_7_;
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[7] =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems[7];
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems._8_7_ =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems._8_7_;
          local_118.m_tapleaf_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
               p.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf];
          puVar6 = pvVar2[uVar12 - 1].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)pvVar2[uVar12 - 1].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar6) < 0x21) {
            __assert_fail("control.size() >= TAPROOT_CONTROL_BASE_SIZE",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                          ,0x745,
                          "bool VerifyTaprootCommitment(const std::vector<unsigned char> &, const std::vector<unsigned char> &, const uint256 &)"
                         );
          }
          puVar7 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          vch.m_size = (long)(program->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
          if (vch.m_size < 0x20) {
            __assert_fail("program.size() >= uint256::size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                          ,0x746,
                          "bool VerifyTaprootCommitment(const std::vector<unsigned char> &, const std::vector<unsigned char> &, const uint256 &)"
                         );
          }
          p.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)(puVar6 + 1);
          p.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(puVar6 + 9);
          p.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)(puVar6 + 0x11);
          p.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar6 + 0x19);
          vch.m_data = puVar7;
          base_blob<256U>::base_blob(&hash_exec_script.super_base_blob<256U>,vch);
          puVar6 = pvVar2[uVar12 - 1].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          control.m_size =
               (long)pvVar2[uVar12 - 1].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar6;
          control.m_data = puVar6;
          ComputeTaprootMerkleRoot(&local_78,control,&local_118.m_tapleaf_hash);
          bVar9 = XOnlyPubKey::CheckTapTweak
                            ((XOnlyPubKey *)&hash_exec_script,&p,&local_78,
                             (bool)(*pvVar2[uVar12 - 1].
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start & 1));
          if (!bVar9) goto LAB_001df3bd;
          local_118.m_tapleaf_hash_init = true;
          if ((*pvVar2[uVar12 - 1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start & 0xfe) == 0xc0) {
            prevector<28U,_unsigned_char,_unsigned_int,_int>::
            prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )pvVar2[uVar12 - 2].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )pvVar2[uVar12 - 2].
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                      (&exec_script.super_CScriptBase,
                       (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p);
            sVar15 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                               (&witness->stack);
            local_118.m_validation_weight_left = sVar15 + 0x32;
            local_118.m_validation_weight_left_init = true;
            bVar9 = ExecuteWitnessScript
                              (&local_198,&exec_script,flags,TAPSCRIPT,checker,&local_118,serror);
            goto LAB_001df3cb;
          }
          if ((flags >> 0x12 & 1) == 0) goto LAB_001df05b;
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION;
          }
        }
      }
    }
  }
  else {
    if (witversion == 0) {
      lVar13 = (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar13 == 0x14) {
        if (lVar16 == 0x30) {
          pCVar14 = CScript::operator<<(&exec_script,OP_DUP);
          pCVar14 = CScript::operator<<(pCVar14,OP_HASH160);
          pbVar4 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          b._M_extent._M_extent_value =
               (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
          b._M_ptr = pbVar4;
          pCVar14 = CScript::operator<<(pCVar14,b);
          pCVar14 = CScript::operator<<(pCVar14,OP_EQUALVERIFY);
          CScript::operator<<(pCVar14,OP_CHECKSIG);
          bVar9 = ExecuteWitnessScript
                            (&local_198,&exec_script,flags,WITNESS_V0,checker,&local_118,serror);
          goto LAB_001df3cb;
        }
      }
      else {
        if (lVar13 != 0x20) {
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH;
          }
          goto LAB_001df3c8;
        }
        if (pvVar3 == pvVar2) goto LAB_001df1a1;
        local_198.m_size = uVar12 - 1;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pvVar2[local_198.m_size].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pvVar2[local_198.m_size].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&exec_script.super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p);
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        hash_exec_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        CSHA256::CSHA256((CSHA256 *)&p);
        uVar17 = exec_script.super_CScriptBase._size - 0x1d;
        data = exec_script.super_CScriptBase._union.indirect_contents.indirect;
        if (exec_script.super_CScriptBase._size < 0x1d) {
          uVar17 = exec_script.super_CScriptBase._size;
          data = &exec_script.super_CScriptBase;
        }
        this = CSHA256::Write((CSHA256 *)&p,(uchar *)data,(ulong)uVar17);
        CSHA256::Finalize(this,(uchar *)&hash_exec_script);
        iVar11 = bcmp(&hash_exec_script,
                      (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start,0x20);
        if (iVar11 == 0) {
          bVar9 = ExecuteWitnessScript
                            (&local_198,&exec_script,flags,WITNESS_V0,checker,&local_118,serror);
          goto LAB_001df3cb;
        }
      }
LAB_001df3bd:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH;
      }
      goto LAB_001df3c8;
    }
LAB_001df00e:
    if (is_p2sh) {
      bVar9 = true;
      if ((flags >> 0xc & 1) == 0) goto LAB_001df3cb;
    }
    else {
      bVar10 = CScript::IsPayToAnchor(witversion,program);
      bVar9 = true;
      if ((flags >> 0xc & 1) == 0 || bVar10) goto LAB_001df3cb;
    }
    if (serror != (ScriptError *)0x0) {
      *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM;
    }
  }
LAB_001df3c8:
  bVar9 = false;
LAB_001df3cb:
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&exec_script.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

static bool VerifyWitnessProgram(const CScriptWitness& witness, int witversion, const std::vector<unsigned char>& program, unsigned int flags, const BaseSignatureChecker& checker, ScriptError* serror, bool is_p2sh)
{
    CScript exec_script; //!< Actually executed script (last stack item in P2WSH; implied P2PKH script in P2WPKH; leaf script in P2TR)
    Span stack{witness.stack};
    ScriptExecutionData execdata;

    if (witversion == 0) {
        if (program.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            // BIP141 P2WSH: 32-byte witness v0 program (which encodes SHA256(script))
            if (stack.size() == 0) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
            }
            const valtype& script_bytes = SpanPopBack(stack);
            exec_script = CScript(script_bytes.begin(), script_bytes.end());
            uint256 hash_exec_script;
            CSHA256().Write(exec_script.data(), exec_script.size()).Finalize(hash_exec_script.begin());
            if (memcmp(hash_exec_script.begin(), program.data(), 32)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else if (program.size() == WITNESS_V0_KEYHASH_SIZE) {
            // BIP141 P2WPKH: 20-byte witness v0 program (which encodes Hash160(pubkey))
            if (stack.size() != 2) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH); // 2 items in witness
            }
            exec_script << OP_DUP << OP_HASH160 << program << OP_EQUALVERIFY << OP_CHECKSIG;
            return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::WITNESS_V0, checker, execdata, serror);
        } else {
            return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WRONG_LENGTH);
        }
    } else if (witversion == 1 && program.size() == WITNESS_V1_TAPROOT_SIZE && !is_p2sh) {
        // BIP341 Taproot: 32-byte non-P2SH witness v1 program (which encodes a P2C-tweaked pubkey)
        if (!(flags & SCRIPT_VERIFY_TAPROOT)) return set_success(serror);
        if (stack.size() == 0) return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_WITNESS_EMPTY);
        if (stack.size() >= 2 && !stack.back().empty() && stack.back()[0] == ANNEX_TAG) {
            // Drop annex (this is non-standard; see IsWitnessStandard)
            const valtype& annex = SpanPopBack(stack);
            execdata.m_annex_hash = (HashWriter{} << annex).GetSHA256();
            execdata.m_annex_present = true;
        } else {
            execdata.m_annex_present = false;
        }
        execdata.m_annex_init = true;
        if (stack.size() == 1) {
            // Key path spending (stack size is 1 after removing optional annex)
            if (!checker.CheckSchnorrSignature(stack.front(), program, SigVersion::TAPROOT, execdata, serror)) {
                return false; // serror is set
            }
            return set_success(serror);
        } else {
            // Script path spending (stack size is >1 after removing optional annex)
            const valtype& control = SpanPopBack(stack);
            const valtype& script = SpanPopBack(stack);
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE || ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) {
                return set_error(serror, SCRIPT_ERR_TAPROOT_WRONG_CONTROL_SIZE);
            }
            execdata.m_tapleaf_hash = ComputeTapleafHash(control[0] & TAPROOT_LEAF_MASK, script);
            if (!VerifyTaprootCommitment(control, program, execdata.m_tapleaf_hash)) {
                return set_error(serror, SCRIPT_ERR_WITNESS_PROGRAM_MISMATCH);
            }
            execdata.m_tapleaf_hash_init = true;
            if ((control[0] & TAPROOT_LEAF_MASK) == TAPROOT_LEAF_TAPSCRIPT) {
                // Tapscript (leaf version 0xc0)
                exec_script = CScript(script.begin(), script.end());
                execdata.m_validation_weight_left = ::GetSerializeSize(witness.stack) + VALIDATION_WEIGHT_OFFSET;
                execdata.m_validation_weight_left_init = true;
                return ExecuteWitnessScript(stack, exec_script, flags, SigVersion::TAPSCRIPT, checker, execdata, serror);
            }
            if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION) {
                return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_TAPROOT_VERSION);
            }
            return set_success(serror);
        }
    } else if (!is_p2sh && CScript::IsPayToAnchor(witversion, program)) {
        return true;
    } else {
        if (flags & SCRIPT_VERIFY_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM) {
            return set_error(serror, SCRIPT_ERR_DISCOURAGE_UPGRADABLE_WITNESS_PROGRAM);
        }
        // Other version/size/p2sh combinations return true for future softfork compatibility
        return true;
    }
    // There is intentionally no return statement here, to be able to use "control reaches end of non-void function" warnings to detect gaps in the logic above.
}